

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O3

void __thiscall
deqp::gls::RandomShaderProgram::shadeFragments
          (RandomShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  ExecutionContext *this_00;
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  Scalar SVar4;
  uint uVar5;
  GenericVec4 *pGVar6;
  uint uVar7;
  VariableType *this_01;
  pointer ppSVar8;
  VariableType *this_02;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int fragNdx;
  long lVar14;
  Shader *this_03;
  int fragNdx_1;
  FragmentPacket *packet;
  int iVar15;
  Scalar *pSVar16;
  long lVar17;
  ExecValueAccess EVar18;
  ExecValueAccess EVar19;
  Vec4 varValue;
  Scalar local_48;
  Scalar local_44;
  Scalar local_40;
  Scalar local_3c;
  FragmentPacket *local_38;
  
  this_00 = &this->m_execCtx;
  local_38 = packets;
  EVar18 = rsg::ExecutionContext::getValue(this_00,this->m_fragColorVar);
  this_01 = EVar18.super_ConstStridedValueAccess<64>.m_type;
  if (0 < numPackets) {
    iVar11 = 0;
    do {
      uVar13 = numPackets - iVar11;
      uVar7 = 0x10;
      if ((int)uVar13 < 0x10) {
        uVar7 = uVar13;
      }
      this_03 = this->m_fragmentShader;
      ppSVar8 = (this_03->m_inputs).
                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this_03->m_inputs).
                                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar8) >> 3))
      {
        uVar12 = 1;
        if (1 < (int)uVar7) {
          uVar12 = (ulong)uVar7;
        }
        lVar17 = 0;
        do {
          uVar5 = (ppSVar8[lVar17]->m_variable->m_type).m_numElements;
          EVar19 = rsg::ExecutionContext::getValue(this_00,ppSVar8[lVar17]->m_variable);
          this_02 = EVar19.super_ConstStridedValueAccess<64>.m_type;
          if (0 < (int)uVar13) {
            pSVar16 = EVar19.super_ConstStridedValueAccess<64>.m_value + 0xc0;
            uVar10 = 0;
            do {
              packet = local_38 + (iVar11 + (int)uVar10);
              lVar14 = 0;
              do {
                rr::readVarying<float>
                          ((rr *)&local_48.boolVal,packet,context,(int)lVar17,(int)lVar14);
                SVar1 = local_48;
                rsg::VariableType::getElementType(this_02);
                SVar2 = local_44;
                pSVar16[lVar14 + -0xc0] = SVar1;
                if (1 < (int)uVar5) {
                  rsg::VariableType::getElementType(this_02);
                  SVar1 = local_40;
                  pSVar16[lVar14 + -0x80] = SVar2;
                  if (uVar5 != 2) {
                    rsg::VariableType::getElementType(this_02);
                    SVar2 = local_3c;
                    pSVar16[lVar14 + -0x40] = SVar1;
                    if (3 < uVar5) {
                      rsg::VariableType::getElementType(this_02);
                      pSVar16[lVar14] = SVar2;
                    }
                  }
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 4);
              uVar10 = uVar10 + 1;
              pSVar16 = pSVar16 + 4;
            } while (uVar10 != uVar12);
          }
          lVar17 = lVar17 + 1;
          this_03 = this->m_fragmentShader;
          ppSVar8 = (this_03->m_inputs).
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (lVar17 < (int)((ulong)((long)(this_03->m_inputs).
                                              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppSVar8) >> 3));
      }
      rsg::Shader::execute(this_03,this_00);
      if (0 < (int)uVar13) {
        uVar12 = 1;
        if (1 < (int)uVar7) {
          uVar12 = (ulong)uVar7;
        }
        iVar15 = iVar11 * 4;
        uVar10 = 0;
        pSVar16 = EVar18.super_ConstStridedValueAccess<64>.m_value + 0xc0;
        do {
          lVar17 = 0;
          do {
            rsg::VariableType::getElementType(this_01);
            SVar1 = pSVar16[lVar17 + -0xc0];
            rsg::VariableType::getElementType(this_01);
            SVar2 = pSVar16[lVar17 + -0x80];
            rsg::VariableType::getElementType(this_01);
            SVar3 = pSVar16[lVar17 + -0x40];
            rsg::VariableType::getElementType(this_01);
            SVar4 = pSVar16[lVar17];
            pGVar6 = context->outputArray;
            iVar9 = (iVar15 + (int)lVar17) * context->numFragmentOutputs;
            *(Scalar *)(pGVar6 + iVar9) = SVar1;
            *(Scalar *)(pGVar6[iVar9].v.uData + 1) = SVar2;
            *(Scalar *)(pGVar6[iVar9].v.uData + 2) = SVar3;
            *(Scalar *)(pGVar6[iVar9].v.uData + 3) = SVar4;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          uVar10 = uVar10 + 1;
          iVar15 = iVar15 + 4;
          pSVar16 = pSVar16 + 4;
        } while (uVar10 != uVar12);
      }
      iVar11 = uVar7 + iVar11;
    } while (iVar11 < numPackets);
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const rsg::ExecConstValueAccess	fragColorAccess	= m_execCtx.getValue(m_fragColorVar);
	int								packetOffset	= 0;

	DE_STATIC_ASSERT(rsg::EXEC_VEC_WIDTH % rr::NUM_FRAGMENTS_PER_PACKET == 0);

	while (packetOffset < numPackets)
	{
		const int	numPacketsToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH / (int)rr::NUM_FRAGMENTS_PER_PACKET);

		// Interpolate varyings.
		for (int varNdx = 0; varNdx < (int)m_fragmentShader.getInputs().size(); ++varNdx)
		{
			const rsg::Variable*		var				= m_fragmentShader.getInputs()[varNdx]->getVariable();
			const rsg::VariableType&	varType			= var->getType();
			const int					numComponents	= varType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
			{
				const rr::FragmentPacket&	packet		= packets[packetOffset+packetNdx];

				for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
				{
					const tcu::Vec4		varValue	= rr::readVarying<float>(packet, context, varNdx, fragNdx);
					const int			dstNdx		= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;

											access.component(0).asFloat(dstNdx) = varValue[0];
					if (numComponents >= 2)	access.component(1).asFloat(dstNdx) = varValue[1];
					if (numComponents >= 3)	access.component(2).asFloat(dstNdx) = varValue[2];
					if (numComponents >= 4)	access.component(3).asFloat(dstNdx) = varValue[3];
				}
			}
		}

		m_fragmentShader.execute(m_execCtx);

		// Store color
		for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
			{
				const int		srcNdx	= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;
				const tcu::Vec4 color	(fragColorAccess.component(0).asFloat(srcNdx),
										 fragColorAccess.component(1).asFloat(srcNdx),
										 fragColorAccess.component(2).asFloat(srcNdx),
										 fragColorAccess.component(3).asFloat(srcNdx));

				rr::writeFragmentOutput(context, packetOffset+packetNdx, fragNdx, 0, color);
			}
		}

		packetOffset += numPacketsToExecute;
	}
}